

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalCommonGenerator.cxx
# Opt level: O2

void __thiscall
cmLocalCommonGenerator::ComputeObjectFilenames
          (cmLocalCommonGenerator *this,
          map<const_cmSourceFile_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *mapping,cmGeneratorTarget *gt)

{
  char *customOutputExtension;
  _Base_ptr p_Var1;
  bool keptSourceExtension;
  bool local_51;
  string local_50;
  
  customOutputExtension = cmGeneratorTarget::GetCustomObjectExtension(gt);
  for (p_Var1 = (mapping->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(mapping->_M_t)._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    cmLocalGenerator::GetObjectFileNameWithoutTarget
              (&local_50,&this->super_cmLocalGenerator,*(cmSourceFile **)(p_Var1 + 1),
               &gt->ObjectDirectory,&local_51,customOutputExtension);
    std::__cxx11::string::operator=((string *)&p_Var1[1]._M_parent,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return;
}

Assistant:

void cmLocalCommonGenerator::ComputeObjectFilenames(
  std::map<cmSourceFile const*, std::string>& mapping,
  cmGeneratorTarget const* gt)
{
  // Determine if these object files should use a custom extension
  char const* custom_ext = gt->GetCustomObjectExtension();
  for (auto& si : mapping) {
    cmSourceFile const* sf = si.first;
    bool keptSourceExtension;
    si.second = this->GetObjectFileNameWithoutTarget(
      *sf, gt->ObjectDirectory, &keptSourceExtension, custom_ext);
  }
}